

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

void stack_node_release(StackNode *self,StackNodeArray *pool,SubtreePool *subtree_pool)

{
  Subtree self_00;
  uint32_t uVar1;
  uint uVar2;
  StackNode **ppSVar3;
  SubtreePool *pool_00;
  uint uVar4;
  Subtree *pSVar5;
  StackNodeArray *pool_01;
  StackNodeArray *__nmemb;
  ulong uVar6;
  StackNode *pSVar7;
  
  do {
    if (self->ref_count == 0) {
      __assert_fail("self->ref_count != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                    ,0x60,"void stack_node_release(StackNode *, StackNodeArray *, SubtreePool *)");
    }
    uVar1 = self->ref_count - 1;
    self->ref_count = uVar1;
    if (uVar1 != 0) {
      return;
    }
    if (self->link_count == 0) {
      pSVar7 = (StackNode *)0x0;
    }
    else {
      uVar2 = self->link_count - 1;
      if (uVar2 != 0) {
        uVar6 = (ulong)uVar2;
        pSVar5 = &self->links[uVar6].subtree;
        do {
          uVar6 = uVar6 - 1;
          pSVar7 = (StackNode *)pSVar5[-1].ptr;
          if ((*pSVar5).ptr != (SubtreeHeapData *)0x0) {
            ts_subtree_release(subtree_pool,*pSVar5);
          }
          stack_node_release(pSVar7,pool,subtree_pool);
          pSVar5 = pSVar5 + -3;
        } while ((int)uVar6 != 0);
      }
      self_00 = self->links[0].subtree;
      if (self_00.ptr != (SubtreeHeapData *)0x0) {
        ts_subtree_release(subtree_pool,self_00);
      }
      pSVar7 = self->links[0].node;
    }
    if (pool->size < 0x32) {
      uVar2 = pool->capacity;
      if (pool->size == uVar2) {
        uVar4 = uVar2 * 2;
        if (uVar4 < 9) {
          uVar4 = 8;
        }
        if (uVar2 < uVar4) {
          __nmemb = (StackNodeArray *)(ulong)uVar4;
          if (pool->contents == (StackNode **)0x0) {
            pool_01 = (StackNodeArray *)0x8;
            ppSVar3 = (StackNode **)calloc((size_t)__nmemb,8);
            if (ppSVar3 == (StackNode **)0x0) goto LAB_0012ef69;
          }
          else {
            __nmemb = (StackNodeArray *)((long)__nmemb << 3);
            pool_01 = __nmemb;
            ppSVar3 = (StackNode **)realloc(pool->contents,(size_t)__nmemb);
            if (ppSVar3 == (StackNode **)0x0) {
              stack_node_release_cold_1();
LAB_0012ef69:
              stack_node_release_cold_2();
              if (__nmemb->contents == (StackNode **)0x0) {
                return;
              }
              if ((*(Subtree *)&__nmemb->size).ptr != (SubtreeHeapData *)0x0) {
                ts_subtree_release(pool_00,*(Subtree *)&__nmemb->size);
              }
              ppSVar3 = __nmemb[1].contents;
              if (ppSVar3 != (StackNode **)0x0) {
                free(*ppSVar3);
                *ppSVar3 = (StackNode *)0x0;
                ppSVar3[1] = (StackNode *)0x0;
                free(__nmemb[1].contents);
              }
              stack_node_release((StackNode *)__nmemb->contents,pool_01,pool_00);
              return;
            }
          }
          pool->contents = ppSVar3;
          pool->capacity = uVar4;
        }
      }
      uVar2 = pool->size;
      pool->size = uVar2 + 1;
      pool->contents[uVar2] = self;
    }
    else {
      free(self);
    }
    self = pSVar7;
    if (pSVar7 == (StackNode *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

static void stack_node_release(StackNode *self, StackNodeArray *pool, SubtreePool *subtree_pool) {
recur:
  assert(self->ref_count != 0);
  self->ref_count--;
  if (self->ref_count > 0) return;

  StackNode *first_predecessor = NULL;
  if (self->link_count > 0) {
    for (unsigned i = self->link_count - 1; i > 0; i--) {
      StackLink link = self->links[i];
      if (link.subtree.ptr) ts_subtree_release(subtree_pool, link.subtree);
      stack_node_release(link.node, pool, subtree_pool);
    }
    StackLink link = self->links[0];
    if (link.subtree.ptr) ts_subtree_release(subtree_pool, link.subtree);
    first_predecessor = self->links[0].node;
  }

  if (pool->size < MAX_NODE_POOL_SIZE) {
    array_push(pool, self);
  } else {
    ts_free(self);
  }

  if (first_predecessor) {
    self = first_predecessor;
    goto recur;
  }
}